

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

int uv_timer_stop(uv_timer_t *handle)

{
  uv_timer_t *handle_local;
  
  if ((handle->flags & 4) == 0) {
    uv__queue_remove(&(handle->node).queue);
  }
  else {
    heap_remove((heap *)&handle->loop->timer_heap,(heap_node *)&(handle->node).queue,timer_less_than
               );
    if (((handle->flags & 4) != 0) &&
       (handle->flags = handle->flags & 0xfffffffb, (handle->flags & 8) != 0)) {
      handle->loop->active_handles = handle->loop->active_handles - 1;
    }
  }
  uv__queue_init(&(handle->node).queue);
  return 0;
}

Assistant:

int uv_timer_stop(uv_timer_t* handle) {
  if (uv__is_active(handle)) {
    heap_remove((struct heap*) &handle->loop->timer_heap,
                (struct heap_node*) &handle->node.heap,
                timer_less_than);
    uv__handle_stop(handle);
  } else {
    uv__queue_remove(&handle->node.queue);
  }

  uv__queue_init(&handle->node.queue);
  return 0;
}